

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# docopt_private.h
# Opt level: O2

size_t __thiscall docopt::Option::hash(Option *this)

{
  size_t local_18;
  
  local_18 = LeafPattern::hash(&this->super_LeafPattern);
  hash_combine<std::__cxx11::string>(&local_18,&this->fShortOption);
  hash_combine<std::__cxx11::string>(&local_18,&this->fLongOption);
  return (local_18 >> 2) + 0x9e3779b9 + local_18 * 0x40 + (long)this->fArgcount ^ local_18;
}

Assistant:

virtual size_t hash() const override {
			size_t seed = LeafPattern::hash();
			hash_combine(seed, fShortOption);
			hash_combine(seed, fLongOption);
			hash_combine(seed, fArgcount);
			return seed;
		}